

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGLDriver::drawHardwareBuffer(COpenGLDriver *this,SHWBufferLink *_HWBuffer)

{
  IMeshBuffer *pIVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 local_48;
  undefined8 uVar7;
  
  if (_HWBuffer != (SHWBufferLink *)0x0) {
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x6b])();
    pIVar1 = _HWBuffer->MeshBuffer;
    iVar2 = (*pIVar1->_vptr_IMeshBuffer[3])(pIVar1);
    uVar7 = CONCAT44(extraout_var,iVar2);
    iVar2 = (*pIVar1->_vptr_IMeshBuffer[7])(pIVar1);
    local_48 = CONCAT44(extraout_var_00,iVar2);
    if (_HWBuffer->Mapped_Vertex != EHM_NEVER) {
      if (*(code **)&this->field_0x9c8 != (code *)0x0) {
        (**(code **)&this->field_0x9c8)(0x8892,*(undefined4 *)&_HWBuffer[1]._vptr_SHWBufferLink);
      }
      uVar7 = 0;
    }
    if (_HWBuffer->Mapped_Index != EHM_NEVER) {
      if (*(code **)&this->field_0x9c8 != (code *)0x0) {
        (**(code **)&this->field_0x9c8)
                  (0x8893,*(undefined4 *)((long)&_HWBuffer[1]._vptr_SHWBufferLink + 4));
      }
      local_48 = 0;
    }
    uVar3 = (*pIVar1->_vptr_IMeshBuffer[5])(pIVar1);
    uVar4 = (*pIVar1->_vptr_IMeshBuffer[0x1e])(pIVar1);
    uVar5 = (*pIVar1->_vptr_IMeshBuffer[2])(pIVar1);
    uVar6 = (*pIVar1->_vptr_IMeshBuffer[0x1d])(pIVar1);
    iVar2 = (*pIVar1->_vptr_IMeshBuffer[6])(pIVar1);
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x2b])
              (this,uVar7,(ulong)uVar3,local_48,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,
               CONCAT44(extraout_var_01,iVar2));
    if ((_HWBuffer->Mapped_Vertex != EHM_NEVER) && (*(code **)&this->field_0x9c8 != (code *)0x0)) {
      (**(code **)&this->field_0x9c8)(0x8892,0);
    }
    if ((_HWBuffer->Mapped_Index != EHM_NEVER) && (*(code **)&this->field_0x9c8 != (code *)0x0)) {
      (**(code **)&this->field_0x9c8)(0x8893,0);
      return;
    }
  }
  return;
}

Assistant:

void COpenGLDriver::drawHardwareBuffer(SHWBufferLink *_HWBuffer)
{
	if (!_HWBuffer)
		return;

	updateHardwareBuffer(_HWBuffer); // check if update is needed

#if defined(GL_ARB_vertex_buffer_object)
	SHWBufferLink_opengl *HWBuffer = (SHWBufferLink_opengl *)_HWBuffer;

	const scene::IMeshBuffer *mb = HWBuffer->MeshBuffer;
	const void *vertices = mb->getVertices();
	const void *indexList = mb->getIndices();

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER) {
		extGlBindBuffer(GL_ARRAY_BUFFER, HWBuffer->vbo_verticesID);
		vertices = 0;
	}

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER) {
		extGlBindBuffer(GL_ELEMENT_ARRAY_BUFFER, HWBuffer->vbo_indicesID);
		indexList = 0;
	}

	drawVertexPrimitiveList(vertices, mb->getVertexCount(), indexList, mb->getPrimitiveCount(), mb->getVertexType(), mb->getPrimitiveType(), mb->getIndexType());

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER)
		extGlBindBuffer(GL_ARRAY_BUFFER, 0);
	if (HWBuffer->Mapped_Index != scene::EHM_NEVER)
		extGlBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
#endif
}